

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void req0_pipe_close(void *arg)

{
  req0_sock *s;
  nni_aio *aio;
  int iVar1;
  req0_ctx *ctx;
  nni_time nVar2;
  
  s = *(req0_sock **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x208));
  nni_aio_close((nni_aio *)((long)arg + 0x40));
  nni_mtx_lock(&s->mtx);
  *(undefined1 *)((long)arg + 0x38) = 1;
  nni_list_node_remove((nni_list_node *)((long)arg + 0x10));
  nni_list_append(&s->stop_pipes,arg);
  iVar1 = nni_list_empty(&s->ready_pipes);
  if (iVar1 != 0) {
    nni_pollable_clear(&s->writable);
  }
  while( true ) {
    ctx = (req0_ctx *)nni_list_first((nni_list *)((long)arg + 0x20));
    if (ctx == (req0_ctx *)0x0) break;
    nni_list_remove((nni_list *)((long)arg + 0x20),ctx);
    if (ctx->retry < 1) {
      aio = ctx->recv_aio;
      if (aio == (nni_aio *)0x0) {
        req0_ctx_reset(ctx);
        ctx->conn_reset = true;
      }
      else {
        ctx->recv_aio = (nni_aio *)0x0;
        nni_aio_finish_error(aio,NNG_ECONNRESET);
        req0_ctx_reset(ctx);
      }
    }
    else if (ctx->req_msg != (nng_msg *)0x0) {
      nVar2 = nni_clock();
      ctx->retry_time = (long)ctx->retry + nVar2;
      iVar1 = nni_list_node_active(&ctx->send_node);
      if (iVar1 == 0) {
        nni_list_append(&s->send_queue,ctx);
        req0_run_send_queue(s,(nni_aio_completions *)0x0);
      }
    }
  }
  nni_mtx_unlock(&s->mtx);
  return;
}

Assistant:

static void
req0_pipe_close(void *arg)
{
	req0_pipe *p = arg;
	req0_sock *s = p->req;
	req0_ctx  *ctx;

	nni_aio_close(&p->aio_recv);
	nni_aio_close(&p->aio_send);

	nni_mtx_lock(&s->mtx);
	// This removes the node from either busy_pipes or ready_pipes.
	// It doesn't much matter which.  We stick the pipe on the stop
	// list, so that we can wait for that to close down safely.
	p->closed = true;
	nni_list_node_remove(&p->node);
	nni_list_append(&s->stop_pipes, p);
	if (nni_list_empty(&s->ready_pipes)) {
		nni_pollable_clear(&s->writable);
	}

	while ((ctx = nni_list_first(&p->contexts)) != NULL) {
		nni_list_remove(&p->contexts, ctx);
		nng_aio *aio;
		if (ctx->retry <= 0) {
			// If we can't retry, then just cancel the operation
			// altogether.  We should only be waiting for recv,
			// because we will already have sent if we are here.
			if ((aio = ctx->recv_aio) != NULL) {
				ctx->recv_aio = NULL;
				nni_aio_finish_error(aio, NNG_ECONNRESET);
				req0_ctx_reset(ctx);
			} else {
				req0_ctx_reset(ctx);
				ctx->conn_reset = true;
			}
		} else if (ctx->req_msg != NULL) {
			// Reset the retry time to make it expire immediately.
			// Also move this immediately to the resend queue.
			// The timer should still be firing, so we don't need
			// to restart or reschedule that.
			ctx->retry_time = nni_clock() + ctx->retry;

			if (!nni_list_node_active(&ctx->send_node)) {
				nni_list_append(&s->send_queue, ctx);
				req0_run_send_queue(s, NULL);
			}
		}
	}
	nni_mtx_unlock(&s->mtx);
}